

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O2

void __thiscall
llvm::yaml::IO::processKey<llvm::DWARFYAML::InitialLength,llvm::yaml::EmptyContext>
          (IO *this,char *Key,InitialLength *Val,bool Required,EmptyContext *Ctx)

{
  int iVar1;
  undefined7 in_register_00000009;
  EmptyContext *Ctx_00;
  undefined8 local_38;
  void *SaveInfo;
  bool UseDefault;
  
  Ctx_00 = (EmptyContext *)((long)&SaveInfo + 7);
  iVar1 = (*this->_vptr_IO[0xf])
                    (this,Key,CONCAT71(in_register_00000009,Required) & 0xffffffff,0,Ctx_00,
                     &local_38);
  if ((char)iVar1 != '\0') {
    yamlize<llvm::DWARFYAML::InitialLength,llvm::yaml::EmptyContext>
              ((yaml *)this,(IO *)Val,(InitialLength *)(ulong)Required,SUB81(Ctx,0),Ctx_00);
    (*this->_vptr_IO[0x10])(this,local_38);
  }
  return;
}

Assistant:

void processKey(const char *Key, T &Val, bool Required, Context &Ctx) {
    void *SaveInfo;
    bool UseDefault;
    if ( this->preflightKey(Key, Required, false, UseDefault, SaveInfo) ) {
      yamlize(*this, Val, Required, Ctx);
      this->postflightKey(SaveInfo);
    }
  }